

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV1
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  size_type __new_size;
  complex<float> *array_00;
  uchar *array_01;
  double *array_02;
  int *array_03;
  long *array_04;
  unsigned_long *array_05;
  short *array_06;
  unsigned_short *array_07;
  uint *array_08;
  longdouble *array_09;
  float *array_10;
  IO *pIVar1;
  pointer array_11;
  pointer pbVar2;
  bool bVar3;
  DataType DVar4;
  BP5Deserializer *this_00;
  long lVar5;
  BP5Deserializer *__s;
  char *pcVar6;
  ostream *poVar7;
  int iVar8;
  DataType type;
  DataType type_00;
  size_t i;
  long lVar9;
  size_type sVar10;
  string *psVar11;
  BP5Deserializer *this_01;
  complex<double> *pcVar12;
  allocator local_466;
  allocator local_465;
  DataType Type;
  BP5Deserializer *local_460;
  int ElemSize;
  undefined1 local_450 [39];
  allocator local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_460 = this;
  if (this->m_LastAttrStep != Step) {
    core::IO::RemoveAllAttributes(this->m_Engine->m_IO);
    this->m_LastAttrStep = Step;
  }
  this_00 = (BP5Deserializer *)FMFormat_of_original(FFSformat);
  lVar5 = format_list_of_FMFormat();
  lVar5 = *(long *)(lVar5 + 8);
  iVar8 = 0;
  while( true ) {
    pcVar6 = *(char **)(lVar5 + (long)iVar8 * 0x18);
    if (pcVar6 == (char *)0x0) break;
    lVar9 = (long)iVar8 * 0x18 + lVar5;
    pcVar12 = (complex<double> *)((long)*(int *)(lVar9 + 0x14) + (long)BaseData);
    bVar3 = NameIndicatesAttrArray(this_00,pcVar6);
    if (bVar3) {
      __new_size = *(size_type *)pcVar12->_M_value;
      this_00 = (BP5Deserializer *)strdup((char *)(*(long *)(lVar9 + 0x18) + 4));
      __s = (BP5Deserializer *)strdup(*(char **)(lVar9 + 0x20));
      this_01 = __s;
      pcVar6 = strchr((char *)__s,0x5b);
      *pcVar6 = '\0';
      DVar4 = TranslateFFSType2ADIOS(this_01,(char *)__s,*(int *)(lVar9 + 0x28));
      if (DVar4 - Int8 < 0xe) {
        switch(DVar4) {
        case Int8:
          pcVar6 = *(char **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_250;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<signed_char>
                    (pIVar1,(string *)local_450,pcVar6,__new_size,&local_428,psVar11,true);
          break;
        case Int16:
          array_06 = *(short **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          psVar11 = &local_270;
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<short>
                    (pIVar1,(string *)local_450,array_06,__new_size,&local_428,psVar11,true);
          break;
        case Int32:
          array_03 = *(int **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_290;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<int>
                    (pIVar1,(string *)local_450,array_03,__new_size,&local_428,psVar11,true);
          break;
        case Int64:
          array_04 = *(long **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_2b0;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<long>
                    (pIVar1,(string *)local_450,array_04,__new_size,&local_428,psVar11,true);
          break;
        case UInt8:
          array_01 = *(uchar **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_2d0;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar1,(string *)local_450,array_01,__new_size,&local_428,psVar11,true);
          break;
        case UInt16:
          array_07 = *(unsigned_short **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_2f0;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar1,(string *)local_450,array_07,__new_size,&local_428,psVar11,true);
          break;
        case UInt32:
          array_08 = *(uint **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_310;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<unsigned_int>
                    (pIVar1,(string *)local_450,array_08,__new_size,&local_428,psVar11,true);
          break;
        case UInt64:
          array_05 = *(unsigned_long **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_330;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar1,(string *)local_450,array_05,__new_size,&local_428,psVar11,true);
          break;
        case Float:
          array_10 = *(float **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_350;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<float>
                    (pIVar1,(string *)local_450,array_10,__new_size,&local_428,psVar11,true);
          break;
        case Double:
          array_02 = *(double **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_370;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<double>
                    (pIVar1,(string *)local_450,array_02,__new_size,&local_428,psVar11,true);
          break;
        case LongDouble:
          array_09 = *(longdouble **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_390;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<long_double>
                    (pIVar1,(string *)local_450,array_09,__new_size,&local_428,psVar11,true);
          break;
        case FloatComplex:
          array_00 = *(complex<float> **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_3b0;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar1,(string *)local_450,array_00,__new_size,&local_428,psVar11,true);
          break;
        case DoubleComplex:
          pcVar12 = *(complex<double> **)(pcVar12->_M_value + 8);
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&array);
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&Type);
          psVar11 = &local_3d0;
          std::__cxx11::string::string((string *)psVar11,"/",(allocator *)&ElemSize);
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar1,(string *)local_450,pcVar12,__new_size,&local_428,psVar11,true);
          break;
        case String:
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          array.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&array,__new_size);
          lVar9 = 0;
          for (sVar10 = 0; __new_size != sVar10; sVar10 = sVar10 + 1) {
            std::__cxx11::string::assign
                      ((char *)((long)&((array.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar9));
            lVar9 = lVar9 + 0x20;
          }
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,(char *)this_00,(allocator *)&Type);
          pbVar2 = array.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          array_11 = array.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&local_428,"",(allocator *)&ElemSize);
          std::__cxx11::string::string((string *)&local_230,"/",&local_466);
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar1,(string *)local_450,array_11,(long)pbVar2 - (long)array_11 >> 5,
                     &local_428,&local_230,true);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)local_450);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&array);
          goto LAB_005d9cdc;
        }
        std::__cxx11::string::~string((string *)psVar11);
        std::__cxx11::string::~string((string *)&local_428);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"Loading attribute matched no type ");
        ToString_abi_cxx11_((string *)local_450,(adios2 *)(ulong)DVar4,type);
        poVar7 = std::operator<<(poVar7,(string *)local_450);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      std::__cxx11::string::~string((string *)local_450);
LAB_005d9cdc:
      free(this_00);
      iVar8 = iVar8 + 2;
    }
    else {
      pcVar6 = BreakdownVarName(this_00,pcVar6,&Type,&ElemSize);
      DVar4 = Type;
      if (Type - Int8 < 0x10) {
        psVar11 = (string *)&array;
        switch(Type) {
        case Int8:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_90;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<signed_char>
                    (pIVar1,(string *)local_450,(char *)pcVar12,&local_428,psVar11,true);
          break;
        case Int16:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_b0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<short>
                    (pIVar1,(string *)local_450,(short *)pcVar12,&local_428,psVar11,true);
          break;
        case Int32:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_d0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<int>
                    (pIVar1,(string *)local_450,(int *)pcVar12,&local_428,psVar11,true);
          break;
        case Int64:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_f0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<long>
                    (pIVar1,(string *)local_450,(long *)pcVar12,&local_428,psVar11,true);
          break;
        case UInt8:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_110;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar1,(string *)local_450,(uchar *)pcVar12,&local_428,psVar11,true);
          break;
        case UInt16:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_130;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar1,(string *)local_450,(unsigned_short *)pcVar12,&local_428,psVar11,true);
          break;
        case UInt32:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_150;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<unsigned_int>
                    (pIVar1,(string *)local_450,(uint *)pcVar12,&local_428,psVar11,true);
          break;
        case UInt64:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_170;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar1,(string *)local_450,(unsigned_long *)pcVar12,&local_428,psVar11,true);
          break;
        case Float:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_190;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<float>
                    (pIVar1,(string *)local_450,(float *)pcVar12,&local_428,psVar11,true);
          break;
        case Double:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_1b0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<double>
                    (pIVar1,(string *)local_450,(double *)pcVar12,&local_428,psVar11,true);
          break;
        case LongDouble:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_1d0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<long_double>
                    (pIVar1,(string *)local_450,(longdouble *)pcVar12,&local_428,psVar11,true);
          break;
        case FloatComplex:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_1f0;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar1,(string *)local_450,(complex<float> *)pcVar12,&local_428,psVar11,true);
          break;
        case DoubleComplex:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_210;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar1,(string *)local_450,pcVar12,&local_428,psVar11,true);
          break;
        case String:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,&local_466);
          std::__cxx11::string::string((string *)&local_428,*(char **)pcVar12->_M_value,&local_465);
          std::__cxx11::string::string((string *)psVar11,"",&local_429);
          std::__cxx11::string::string((string *)&local_50,"/",(allocator *)(local_450 + 0x26));
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar1,(string *)local_450,&local_428,psVar11,&local_50,true);
          std::__cxx11::string::~string((string *)&local_50);
          break;
        case Char:
          pIVar1 = local_460->m_Engine->m_IO;
          std::__cxx11::string::string((string *)local_450,pcVar6,(allocator *)psVar11);
          std::__cxx11::string::string((string *)&local_428,"",&local_466);
          psVar11 = &local_70;
          std::__cxx11::string::string((string *)psVar11,"/",&local_465);
          core::IO::DefineAttribute<char>
                    (pIVar1,(string *)local_450,(char *)pcVar12,&local_428,psVar11,true);
          break;
        case Struct:
          goto switchD_005d966c_caseD_10;
        }
        std::__cxx11::string::~string((string *)psVar11);
        std::__cxx11::string::~string((string *)&local_428);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"Loading attribute matched no type ");
        ToString_abi_cxx11_((string *)local_450,(adios2 *)(ulong)DVar4,type_00);
        poVar7 = std::operator<<(poVar7,(string *)local_450);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      this_00 = (BP5Deserializer *)local_450;
      std::__cxx11::string::~string((string *)this_00);
      iVar8 = iVar8 + 1;
    }
  }
switchD_005d966c_caseD_10:
  return;
}

Assistant:

void BP5Deserializer::InstallAttributesV1(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    FMFieldList FieldList;
    FMStructDescList FormatList;

    if (Step != m_LastAttrStep)
    {
        m_Engine->m_IO.RemoveAllAttributes();
        m_LastAttrStep = Step;
    }
    FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
    FieldList = FormatList[0].field_list;
    int i = 0;
    while (FieldList[i].field_name)
    {
        void *field_data = (char *)BaseData + FieldList[i].field_offset;

        if (!NameIndicatesAttrArray(FieldList[i].field_name))
        {
            DataType Type;
            int ElemSize;
            const char *FieldName = BreakdownVarName(FieldList[i].field_name, &Type, &ElemSize);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, *(char **)field_data, "",
                                                            "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, *(T *)field_data, "", "/", true);             \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
            i++;
        }
        else
        {
            DataType Type;
            size_t ElemCount = *(size_t *)field_data;
            field_data = (void *)((char *)field_data + sizeof(size_t));
            i++;
            char *FieldName = strdup(FieldList[i].field_name + 4); // skip BP5_
            char *FieldType = strdup(FieldList[i].field_type);
            *strchr(FieldType, '[') = 0;
            Type = (DataType)TranslateFFSType2ADIOS(FieldType, FieldList[i].field_size);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                std::vector<std::string> array;
                array.resize(ElemCount);
                char **str_array = *(char ***)field_data;
                for (size_t i = 0; i < ElemCount; i++)
                {
                    array[i].assign(str_array[i]);
                }
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, array.data(), array.size(),
                                                            "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        T **array = *(T ***)field_data;                                                            \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, (T *)array, ElemCount, "", "/", true);        \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }